

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_> *
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
          (unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_1,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_2,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_3,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_4,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_5)

{
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_> *in_RDI;
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *in_R8;
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *in_R9;
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
  *in_stack_ffffffffffffff98;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
  *moreGenerators_1_00;
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *moreGenerators_00;
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
  *in_stack_ffffffffffffffb8;
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
  *in_stack_ffffffffffffffc8;
  
  moreGenerators_00 =
       (unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *)
       &stack0xffffffffffffffc8;
  moreGenerators_1_00 = in_RDI;
  value<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
            (in_stack_ffffffffffffffc8);
  makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
            (in_stack_ffffffffffffffb8,moreGenerators_00,
             (unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *)
             moreGenerators_1_00,
             (unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *)in_RDI,
             in_stack_ffffffffffffff98,in_R9,in_R8);
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>::
  ~GeneratorWrapper((GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
                     *)0x443f5c);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }